

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O2

void free_matched_table(ecs_matched_table_t *table)

{
  (*ecs_os_api.free_)((table->iter_data).columns);
  (*ecs_os_api.free_)((table->iter_data).components);
  (*ecs_os_api.free_)((table->iter_data).types);
  (*ecs_os_api.free_)((table->iter_data).references);
  (*ecs_os_api.free_)(table->sparse_columns);
  (*ecs_os_api.free_)(table->bitset_columns);
  (*ecs_os_api.free_)(table->monitor);
  return;
}

Assistant:

static
void free_matched_table(
    ecs_matched_table_t *table)
{
    ecs_os_free(table->iter_data.columns);
    ecs_os_free(table->iter_data.components);
    ecs_os_free((ecs_vector_t**)table->iter_data.types);
    ecs_os_free(table->iter_data.references);
    ecs_os_free(table->sparse_columns);
    ecs_os_free(table->bitset_columns);
    ecs_os_free(table->monitor);
}